

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorPool::TryFindExtensionInFallbackDatabase
          (DescriptorPool *this,Descriptor *containing_type,int field_number)

{
  int iVar1;
  FileDescriptor *pFVar2;
  bool bVar3;
  FileDescriptorProto file_proto;
  FileDescriptorProto FStack_f8;
  
  if (this->fallback_database_ != (DescriptorDatabase *)0x0) {
    FileDescriptorProto::FileDescriptorProto(&FStack_f8);
    iVar1 = (*this->fallback_database_->_vptr_DescriptorDatabase[4])
                      (this->fallback_database_,*(undefined8 *)(containing_type + 8),
                       (ulong)(uint)field_number,&FStack_f8);
    if (((char)iVar1 == '\0') ||
       (pFVar2 = Tables::FindFile((this->tables_)._M_t.
                                  super___uniq_ptr_impl<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_google::protobuf::DescriptorPool::Tables_*,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                                  .
                                  super__Head_base<0UL,_google::protobuf::DescriptorPool::Tables_*,_false>
                                  ._M_head_impl,FStack_f8.name_.ptr_),
       pFVar2 != (FileDescriptor *)0x0)) {
      bVar3 = false;
    }
    else {
      pFVar2 = BuildFileFromDatabase(this,&FStack_f8);
      bVar3 = pFVar2 != (FileDescriptor *)0x0;
    }
    FileDescriptorProto::~FileDescriptorProto(&FStack_f8);
    return bVar3;
  }
  return false;
}

Assistant:

bool DescriptorPool::TryFindExtensionInFallbackDatabase(
    const Descriptor* containing_type, int field_number) const {
  if (fallback_database_ == nullptr) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingExtension(
          containing_type->full_name(), field_number, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != nullptr) {
    // We've already loaded this file, and it apparently doesn't contain the
    // extension we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == nullptr) {
    return false;
  }

  return true;
}